

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

Matcher<const_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>_&>
* __thiscall
testing::internal::EachMatcher::operator_cast_to_Matcher
          (Matcher<const_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>_&>
           *__return_storage_ptr__,EachMatcher *this)

{
  char *s;
  undefined8 *puVar1;
  undefined4 *puVar2;
  
  puVar1 = (undefined8 *)operator_new(0x20);
  s = *(char **)this;
  *puVar1 = &PTR__QuantifierMatcherImpl_00194a38;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *)(puVar1 + 1),s);
  *puVar1 = &PTR__QuantifierMatcherImpl_001949b8;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>_&>
  ).vtable_ = (VTable *)
              MatcherBase<std::array<std::__cxx11::string,2ul>const&>::
              GetVTable<testing::internal::MatcherBase<std::array<std::__cxx11::string,2ul>const&>::ValuePolicy<testing::MatcherInterface<std::array<std::__cxx11::string,2ul>const&>const*,true>>()
              ::kVTable_abi_cxx11_;
  puVar2 = (undefined4 *)operator_new(0x10);
  *puVar2 = 1;
  *(undefined8 **)(puVar2 + 2) = puVar1;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>_&>
  ).buffer_.ptr = puVar2;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>_&>
  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00194a70;
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Container>() const {
    return Matcher<Container>(
        new EachMatcherImpl<const Container&>(inner_matcher_));
  }